

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O1

DdNode * cuddZddDiff(DdManager *zdd,DdNode *P,DdNode *Q)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *T;
  DdNode *E;
  int iVar4;
  ulong uVar5;
  
  pDVar3 = zdd->zero;
  if (pDVar3 == P) {
    return pDVar3;
  }
  if (pDVar3 == Q) {
    return P;
  }
  if (P == Q) {
    return pDVar3;
  }
  pDVar3 = cuddCacheLookup2Zdd(zdd,cuddZddDiff,P,Q);
  if ((DdNode *)0x1 < pDVar3) {
    return pDVar3;
  }
  iVar2 = 0x7fffffff;
  iVar4 = 0x7fffffff;
  if ((ulong)P->index != 0x7fffffff) {
    iVar4 = zdd->permZ[P->index];
  }
  if ((ulong)Q->index != 0x7fffffff) {
    iVar2 = zdd->permZ[Q->index];
  }
  if (iVar4 < iVar2) {
    T = cuddZddDiff(zdd,(P->type).kids.E,Q);
    if (T == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    uVar5 = (ulong)T & 0xfffffffffffffffe;
    *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
    pDVar3 = cuddZddGetNode(zdd,P->index,(P->type).kids.T,T);
    if (pDVar3 == (DdNode *)0x0) goto LAB_008113ca;
  }
  else {
    if (iVar2 < iVar4) {
      pDVar3 = cuddZddDiff(zdd,P,(Q->type).kids.E);
      if (pDVar3 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      goto LAB_008113aa;
    }
    T = cuddZddDiff(zdd,(P->type).kids.T,(Q->type).kids.T);
    if (T == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    E = cuddZddDiff(zdd,(P->type).kids.E,(Q->type).kids.E);
    if (E == (DdNode *)0x0) {
LAB_008113ca:
      Cudd_RecursiveDerefZdd(zdd,T);
      return (DdNode *)0x0;
    }
    uVar5 = (ulong)E & 0xfffffffffffffffe;
    *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
    pDVar3 = cuddZddGetNode(zdd,P->index,T,E);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(zdd,T);
      T = E;
      goto LAB_008113ca;
    }
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
LAB_008113aa:
  cuddCacheInsert2(zdd,cuddZddDiff,P,Q,pDVar3);
  return pDVar3;
}

Assistant:

DdNode *
cuddZddDiff(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *e, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (Q == empty)
        return(P);
    if (P == Q)
        return(empty);

    /* Check cache.  The cache is shared by Cudd_zddDiffConst(). */
    res = cuddCacheLookup2Zdd(table, cuddZddDiff, P, Q);
    if (res != NULL && res != DD_NON_CONSTANT)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        e = cuddZddDiff(zdd, cuddE(P), Q);
        if (e == NULL) return(NULL);
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, cuddT(P), e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(e);
    } else if (p_top > q_top) {
        res = cuddZddDiff(zdd, P, cuddE(Q));
        if (res == NULL) return(NULL);
    } else {
        t = cuddZddDiff(zdd, cuddT(P), cuddT(Q));
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddDiff(zdd, cuddE(P), cuddE(Q));
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(table, t);
            Cudd_RecursiveDerefZdd(table, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(table, cuddZddDiff, P, Q, res);

    return(res);

}